

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O0

PyObject *
boost::python::objects::
class_cref_wrapper<GlobalStimulationSettings,_boost::python::objects::make_instance<GlobalStimulationSettings,_boost::python::objects::value_holder<GlobalStimulationSettings>_>_>
::convert(GlobalStimulationSettings *x)

{
  PyObject *pPVar1;
  GlobalStimulationSettings *in_RDI;
  reference_wrapper<const_GlobalStimulationSettings> *in_stack_00000008;
  undefined1 local_18 [16];
  undefined1 *local_8;
  
  local_8 = local_18;
  addressof<GlobalStimulationSettings_const>(in_RDI);
  pPVar1 = make_instance_impl<GlobalStimulationSettings,boost::python::objects::value_holder<GlobalStimulationSettings>,boost::python::objects::make_instance<GlobalStimulationSettings,boost::python::objects::value_holder<GlobalStimulationSettings>>>
           ::execute<boost::reference_wrapper<GlobalStimulationSettings_const>const>
                     (in_stack_00000008);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }